

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_stfqu(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGContext_conflict10 *tcg_ctx_01;
  TCGTemp *a1;
  TCGTemp *a2;
  TCGTemp *pTVar1;
  uintptr_t o_1;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGv_i64 ret;
  uint uVar2;
  uintptr_t o_2;
  TCGv_i64 EA;
  uint uVar3;
  uintptr_t o_3;
  TCGv_i64 val;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar3 = ctx->opcode;
  uVar2 = uVar3 >> 0x15;
  if ((ctx->need_access_type == true) && (ctx->access_type != 0x30)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_movi_i32,(TCGArg)(cpu_access_type + (long)tcg_ctx_00),0x30
                     );
    ctx->access_type = 0x30;
  }
  uVar3 = uVar3 >> 0x10 & 0x1f;
  a1 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)a1 - (long)tcg_ctx_00);
  a2 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  EA = (TCGv_i64)((long)a2 - (long)tcg_ctx_00);
  gen_addr_imm_index(ctx,EA,0);
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)a1,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uVar2 & 0x1f) << 4) + 0x12b28);
  tcg_gen_qemu_st_i64_ppc64
            (ctx->uc->tcg_ctx,val,EA,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  pTVar1 = tcg_temp_new_internal_ppc64(tcg_ctx_00,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)tcg_ctx_00);
  tcg_ctx_01 = ctx->uc->tcg_ctx;
  tcg_gen_addi_i64_ppc64(tcg_ctx_01,ret,EA,8);
  if (ctx->sf_mode == false) {
    tcg_gen_ext32u_i64_ppc64(tcg_ctx_01,ret,ret);
  }
  tcg_gen_op3_ppc64(tcg_ctx_00,INDEX_op_ld_i64,(TCGArg)a1,
                    (TCGArg)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00),
                    (ulong)((uVar2 * 0x10 + 0x10 & 0x1f0) + 0x12b28));
  tcg_gen_qemu_st_i64_ppc64
            (ctx->uc->tcg_ctx,val,ret,(long)ctx->mem_idx,ctx->default_tcg_memop_mask | MO_64);
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(ret + (long)tcg_ctx_00));
  if ((uVar3 != 0) && (cpu_gpr[uVar3] != EA)) {
    tcg_gen_op2_ppc64(tcg_ctx_00,INDEX_op_mov_i64,(TCGArg)(cpu_gpr[uVar3] + (long)tcg_ctx_00),
                      (TCGArg)a2);
  }
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(EA + (long)tcg_ctx_00));
  tcg_temp_free_internal_ppc64(tcg_ctx_00,(TCGTemp *)(val + (long)tcg_ctx_00));
  return;
}

Assistant:

static void gen_stfqu(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int ra = rA(ctx->opcode);
    int rd = rD(ctx->opcode);
    TCGv t0, t1;
    TCGv_i64 t2;
    gen_set_access_type(ctx, ACCESS_FLOAT);
    t2 = tcg_temp_new_i64(tcg_ctx);
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_imm_index(ctx, t0, 0);
    get_fpr(tcg_ctx, t2, rd);
    gen_qemu_st64_i64(ctx, t2, t0);
    t1 = tcg_temp_new(tcg_ctx);
    gen_addr_add(ctx, t1, t0, 8);
    get_fpr(tcg_ctx, t2, (rd + 1) % 32);
    gen_qemu_st64_i64(ctx, t2, t1);
    tcg_temp_free(tcg_ctx, t1);
    if (ra != 0) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], t0);
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t2);
}